

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O2

size_t t3vsprintf(char *buf,size_t buflen,char *fmt,__va_list_tag *args0)

{
  byte bVar1;
  byte bVar2;
  void *pvVar3;
  byte bVar4;
  uint *puVar5;
  ulong uVar6;
  int *piVar7;
  undefined8 *puVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  undefined8 uVar14;
  size_t sVar15;
  int iVar16;
  char *pcVar17;
  byte bVar18;
  byte bVar19;
  char *__s;
  byte *pbVar20;
  byte *pbVar21;
  size_t sVar22;
  bool bVar23;
  va_list args;
  char buf_1 [20];
  
  pvVar3 = args0->reg_save_area;
  args[0].gp_offset = args0->gp_offset;
  args[0].overflow_arg_area = args0->overflow_arg_area;
  sVar15 = 0;
  do {
    __s = buf_1;
    bVar1 = *fmt;
    if (bVar1 == 0x25) {
      bVar1 = ((byte *)fmt)[1];
      lVar11 = 1;
      bVar18 = bVar1;
      if (bVar1 == 0x7e) {
        bVar18 = ((byte *)fmt)[2];
        lVar11 = 2;
      }
      pbVar20 = (byte *)fmt + (ulong)(bVar18 == 0x2b) + lVar11;
      bVar2 = ((byte *)fmt)[(ulong)(bVar18 == 0x2b) + lVar11];
      bVar19 = bVar2;
      if (bVar2 == 0x2d) {
        pbVar21 = pbVar20 + 1;
        pbVar20 = pbVar20 + 1;
        bVar19 = *pbVar21;
      }
      bVar4 = bVar19;
      if ((int)(char)bVar19 - 0x3aU < 0xfffffff6) {
        if (bVar19 == 0x2a) {
          uVar6 = (ulong)args[0].gp_offset;
          if (uVar6 < 0x29) {
            args[0].gp_offset = args[0].gp_offset + 8;
            piVar7 = (int *)(uVar6 + (long)pvVar3);
          }
          else {
            piVar7 = (int *)args[0].overflow_arg_area;
            args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
          }
          iVar16 = *piVar7;
          pbVar21 = pbVar20 + 1;
          pbVar20 = pbVar20 + 1;
          bVar4 = *pbVar21;
        }
        else {
          iVar16 = -1;
        }
      }
      else {
        iVar16 = 0;
        while ((int)(char)bVar4 - 0x30U < 10) {
          iVar16 = ((int)(char)bVar4 - 0x30U) + iVar16 * 10;
          pbVar21 = pbVar20 + 1;
          pbVar20 = pbVar20 + 1;
          bVar4 = *pbVar21;
        }
      }
      if (bVar4 == 0x2e) {
        bVar4 = pbVar20[1];
        if (bVar4 == 0x2a) {
          uVar6 = (ulong)args[0].gp_offset;
          if (uVar6 < 0x29) {
            args[0].gp_offset = args[0].gp_offset + 8;
            puVar5 = (uint *)(uVar6 + (long)pvVar3);
          }
          else {
            puVar5 = (uint *)args[0].overflow_arg_area;
            args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
          }
          uVar9 = *puVar5;
          bVar4 = pbVar20[2];
          pbVar20 = pbVar20 + 2;
        }
        else {
          uVar9 = 0;
          pbVar21 = pbVar20;
          while( true ) {
            pbVar20 = pbVar21 + 1;
            if (9 < (int)(char)bVar4 - 0x30U) break;
            uVar9 = ((int)(char)bVar4 - 0x30U) + uVar9 * 10;
            bVar4 = pbVar21[2];
            pbVar21 = pbVar20;
          }
        }
      }
      else {
        uVar9 = 0xffffffff;
      }
      bVar23 = false;
      switch(bVar4) {
      case 0x6f:
        uVar6 = (ulong)args[0].gp_offset;
        if (uVar6 < 0x29) {
          args[0].gp_offset = args[0].gp_offset + 8;
          puVar5 = (uint *)(uVar6 + (long)pvVar3);
        }
        else {
          puVar5 = (uint *)args[0].overflow_arg_area;
          args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
        }
        uVar6 = (ulong)*puVar5;
        pcVar17 = "%o";
        break;
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x76:
      case 0x77:
        goto switchD_001f61b3_caseD_70;
      case 0x73:
        uVar6 = (ulong)args[0].gp_offset;
        if (uVar6 < 0x29) {
          args[0].gp_offset = args[0].gp_offset + 8;
          puVar8 = (undefined8 *)(uVar6 + (long)pvVar3);
        }
        else {
          puVar8 = (undefined8 *)args[0].overflow_arg_area;
          args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
        }
        uVar10 = (ulong)iVar16;
        __s = (char *)*puVar8;
        if ((byte *)__s == (byte *)0x0) {
          __s = "(null)";
        }
        uVar6 = 0;
        while( true ) {
          if ((((byte *)__s)[uVar6] == 0) ||
             (uVar9 != 0xffffffff && (ulong)(long)(int)uVar9 <= uVar6)) break;
          uVar6 = uVar6 + 1;
        }
        bVar23 = false;
        if (bVar1 == 0x7e) {
          iVar12 = iVar16 + -3;
          if (0xffffffc1 < iVar16 - 0x3dU) {
            iVar12 = 0x3c;
          }
          uVar13 = (ulong)iVar12;
          bVar23 = uVar13 < uVar6;
          if (uVar13 <= uVar6) {
            uVar6 = uVar13;
          }
        }
        if ((bVar2 == 0x2d) || (uVar13 = uVar10, iVar16 == -1)) {
          pbVar21 = (byte *)0x2a7c85;
        }
        else {
          for (; uVar6 < uVar13; uVar13 = uVar13 - 1) {
            if (1 < buflen) {
              buflen = buflen - 1;
              *buf = 0x20;
              buf = (char *)((byte *)buf + 1);
            }
            sVar15 = sVar15 + 1;
          }
          if (uVar6 < uVar10) {
            uVar10 = uVar6;
          }
          pbVar21 = (byte *)0x2a7c85;
          iVar16 = (int)uVar10;
        }
        goto LAB_001f6676;
      case 0x75:
        uVar6 = (ulong)args[0].gp_offset;
        if (uVar6 < 0x29) {
          args[0].gp_offset = args[0].gp_offset + 8;
          puVar5 = (uint *)(uVar6 + (long)pvVar3);
        }
        else {
          puVar5 = (uint *)args[0].overflow_arg_area;
          args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
        }
        uVar6 = (ulong)*puVar5;
        pcVar17 = "%u";
        break;
      case 0x78:
        uVar6 = (ulong)args[0].gp_offset;
        if (uVar6 < 0x29) {
          args[0].gp_offset = args[0].gp_offset + 8;
          puVar5 = (uint *)(uVar6 + (long)pvVar3);
        }
        else {
          puVar5 = (uint *)args[0].overflow_arg_area;
          args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
        }
        uVar6 = (ulong)*puVar5;
        pcVar17 = "%x";
        break;
      default:
        if (bVar4 == 0x25) {
LAB_001f61df:
          __s = "%";
LAB_001f6597:
          pbVar21 = (byte *)0x2a7c85;
          uVar6 = 1;
          goto LAB_001f6676;
        }
        if (bVar4 != 0x50) {
          if (bVar4 == 99) {
            uVar6 = (ulong)args[0].gp_offset;
            if (uVar6 < 0x29) {
              args[0].gp_offset = args[0].gp_offset + 8;
              pcVar17 = (char *)(uVar6 + (long)pvVar3);
            }
            else {
              pcVar17 = (char *)args[0].overflow_arg_area;
              args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
            }
            buf_1[0] = *pcVar17;
            goto LAB_001f6597;
          }
          if (bVar4 != 100) {
            if (bVar4 != 0x6c) {
switchD_001f61b3_caseD_70:
              pbVar20 = (byte *)fmt;
              goto LAB_001f61df;
            }
            bVar1 = pbVar20[1];
            pbVar20 = pbVar20 + 1;
            if (bVar1 == 0x78) {
              uVar6 = (ulong)args[0].gp_offset;
              if (uVar6 < 0x29) {
                args[0].gp_offset = args[0].gp_offset + 8;
                puVar8 = (undefined8 *)(uVar6 + (long)pvVar3);
              }
              else {
                puVar8 = (undefined8 *)args[0].overflow_arg_area;
                args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
              }
              uVar14 = *puVar8;
              pcVar17 = "%lx";
            }
            else if (bVar1 == 0x6f) {
              uVar6 = (ulong)args[0].gp_offset;
              if (uVar6 < 0x29) {
                args[0].gp_offset = args[0].gp_offset + 8;
                puVar8 = (undefined8 *)(uVar6 + (long)pvVar3);
              }
              else {
                puVar8 = (undefined8 *)args[0].overflow_arg_area;
                args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
              }
              uVar14 = *puVar8;
              pcVar17 = "%lo";
            }
            else if (bVar1 == 0x75) {
              uVar6 = (ulong)args[0].gp_offset;
              if (uVar6 < 0x29) {
                args[0].gp_offset = args[0].gp_offset + 8;
                puVar8 = (undefined8 *)(uVar6 + (long)pvVar3);
              }
              else {
                puVar8 = (undefined8 *)args[0].overflow_arg_area;
                args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
              }
              uVar14 = *puVar8;
              pcVar17 = "%lu";
            }
            else {
              if (bVar1 != 100) goto switchD_001f61b3_caseD_70;
              uVar6 = (ulong)args[0].gp_offset;
              if (uVar6 < 0x29) {
                args[0].gp_offset = args[0].gp_offset + 8;
                puVar8 = (undefined8 *)(uVar6 + (long)pvVar3);
              }
              else {
                puVar8 = (undefined8 *)args[0].overflow_arg_area;
                args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
              }
              uVar14 = *puVar8;
              pcVar17 = "%ld";
            }
            sprintf(__s,pcVar17,uVar14);
            goto LAB_001f63d3;
          }
          uVar6 = (ulong)args[0].gp_offset;
          if (uVar6 < 0x29) {
            args[0].gp_offset = args[0].gp_offset + 8;
            piVar7 = (int *)(uVar6 + (long)pvVar3);
          }
          else {
            piVar7 = (int *)args[0].overflow_arg_area;
            args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
          }
          iVar12 = *piVar7;
          sprintf(__s,"%d");
          if (pbVar20[1] == 0x74) {
            if (pbVar20[2] != 0x68) goto LAB_001f63d3;
            pbVar20 = pbVar20 + 2;
            if (iVar12 % 100 - 0x15U < 0xfffffff5) {
              iVar12 = iVar12 % 10;
              if (iVar12 == 3) {
                pbVar21 = (byte *)0x2b2c7b;
              }
              else if (iVar12 == 2) {
                pbVar21 = (byte *)0x2a99a8;
              }
              else {
                if (iVar12 != 1) goto LAB_001f6785;
                pbVar21 = (byte *)0x2aba06;
              }
            }
            else {
LAB_001f6785:
              pbVar21 = (byte *)0x2b2e4a;
            }
          }
          else {
            pbVar21 = (byte *)0x2a7c85;
          }
          goto LAB_001f63da;
        }
        uVar6 = (ulong)args[0].gp_offset;
        if (uVar6 < 0x29) {
          args[0].gp_offset = args[0].gp_offset + 8;
          puVar8 = (undefined8 *)(uVar6 + (long)pvVar3);
        }
        else {
          puVar8 = (undefined8 *)args[0].overflow_arg_area;
          args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
        }
        __s = (char *)*puVar8;
        if ((byte *)__s == (byte *)0x0) {
          __s = "";
        }
        if ((int)uVar9 < 0) {
          sVar22 = strlen(__s);
        }
        else {
          sVar22 = (size_t)uVar9;
        }
        while( true ) {
          bVar23 = sVar22 == 0;
          sVar22 = sVar22 - 1;
          if (bVar23) break;
          uVar9 = (byte)*__s - 0x20;
          if ((uVar9 < 0x3e) && ((0x28000001ac009fdbU >> ((ulong)uVar9 & 0x3f) & 1) != 0)) {
            sprintf(buf_1,"%%%02x");
            for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
              if (1 < buflen) {
                *buf = buf_1[lVar11];
                buf = (char *)((byte *)buf + 1);
                buflen = buflen - 1;
              }
            }
            sVar15 = sVar15 + 3;
          }
          else {
            sVar15 = sVar15 + 1;
            if (1 < buflen) {
              *buf = *__s;
              buf = (char *)((byte *)buf + 1);
              buflen = buflen - 1;
            }
          }
          __s = (char *)((byte *)__s + 1);
        }
        uVar6 = 0;
        pbVar21 = (byte *)0x2a7c85;
        goto LAB_001f6673;
      }
      sprintf(__s,pcVar17,uVar6);
LAB_001f63d3:
      pbVar21 = (byte *)0x2a7c85;
LAB_001f63da:
      uVar6 = strlen(buf_1);
      if (bVar2 == 0x2d) {
        __s = buf_1;
LAB_001f6673:
        bVar23 = false;
      }
      else {
        bVar23 = false;
        if (iVar16 != -1) {
          uVar10 = (ulong)iVar16;
          __s = buf_1;
          if (uVar6 < uVar10) {
            if (buf_1[0] == '-' || bVar18 != 0x2b) {
LAB_001f644f:
              if ((bVar19 == 0x30) && (buf_1[0] == '-')) {
                if (1 < buflen) {
                  buflen = buflen - 1;
                  *buf = 0x2d;
                  buf = (char *)((byte *)buf + 1);
                }
                sVar15 = sVar15 + 1;
                uVar6 = uVar6 - 1;
                __s = buf_1 + 1;
              }
            }
            else {
              sVar15 = sVar15 + 1;
              if (1 < buflen) {
                buflen = buflen - 1;
                *buf = 0x2b;
                buf = (char *)((byte *)buf + 1);
                goto LAB_001f644f;
              }
            }
            for (uVar13 = uVar10; uVar6 < uVar13; uVar13 = uVar13 - 1) {
              if (1 < buflen) {
                buflen = buflen - 1;
                *buf = (bVar19 == 0x30) << 4 | 0x20;
                buf = (char *)((byte *)buf + 1);
              }
              sVar15 = sVar15 + 1;
            }
            if (uVar6 < uVar10) {
              uVar10 = uVar6;
            }
            iVar16 = (int)uVar10;
            goto LAB_001f6676;
          }
        }
        __s = buf_1;
      }
LAB_001f6676:
      for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        if (1 < buflen) {
          buflen = buflen - 1;
          *buf = ((byte *)__s)[uVar10];
          buf = (char *)((byte *)buf + 1);
        }
      }
      sVar15 = sVar15 + uVar6;
      for (; *pbVar21 != 0; pbVar21 = pbVar21 + 1) {
        if (1 < buflen) {
          buflen = buflen - 1;
          *buf = *pbVar21;
          buf = (char *)((byte *)buf + 1);
        }
        sVar15 = sVar15 + 1;
      }
      if (bVar23) {
        for (lVar11 = 0; lVar11 != -3; lVar11 = lVar11 + -1) {
          if (1 < buflen) {
            buflen = buflen - 1;
            *buf = 0x2e;
            buf = (char *)((byte *)buf + 1);
          }
        }
        uVar6 = uVar6 + 3;
        sVar15 = sVar15 + 3;
      }
      fmt = (char *)pbVar20;
      if (((bVar2 == 0x2d) && (iVar16 != -1)) && (uVar10 = (ulong)iVar16, uVar6 < uVar10)) {
        for (; uVar6 < uVar10; uVar10 = uVar10 - 1) {
          if (1 < buflen) {
            buflen = buflen - 1;
            *buf = 0x20;
            buf = (char *)((byte *)buf + 1);
          }
          sVar15 = sVar15 + 1;
        }
      }
    }
    else {
      if (bVar1 == 0) {
        if (buflen != 0) {
          *buf = 0;
        }
        return sVar15;
      }
      sVar15 = sVar15 + 1;
      if (1 < buflen) {
        buflen = buflen - 1;
        *buf = bVar1;
        buf = (char *)((byte *)buf + 1);
      }
    }
    fmt = (char *)((byte *)fmt + 1);
  } while( true );
}

Assistant:

size_t t3vsprintf(char *buf, size_t buflen, const char *fmt, va_list args0)
{
    size_t rem;
    size_t need = 0;
    char *dst;

    /* 
     *   make a private copy of the arguments, to ensure that we don't modify
     *   the caller's copy (on some platforms, va_list is a reference type;
     *   the caller might want to reuse their argument pointer for a two-pass
     *   operation, such as a pre-format pass to measure how much space is
     *   needed) 
     */
    va_list args;
    os_va_copy(args, args0);

    /* scan the buffer */
    for (dst = buf, rem = buflen ; *fmt != '\0' ; ++fmt)
    {
        /* check for a format specifier */
        if (*fmt == '%')
        {
            const char *fmt_start = fmt;
            const char *nth = "";
            const char *txt;
            size_t txtlen;
            char buf[20];
            int fld_wid = -1;
            int fld_prec = -1;
            char lead_char = ' ';
            int plus = FALSE;
            int approx = FALSE;
            int add_ellipsis = FALSE;
            int left_align = FALSE;
            size_t i;

            /* skip the '%' */
            ++fmt;

            /* check for the "approximation" flag */
            if (*fmt == '~')
            {
                approx = TRUE;
                ++fmt;
            }

            /* check for an explicit sign */
            if (*fmt == '+')
            {
                plus = TRUE;
                ++fmt;
            }

            /* check for left alignment */
            if (*fmt == '-')
            {
                left_align = TRUE;
                ++fmt;
            }

            /* if leading zeros are desired, note it */
            if (*fmt == '0')
                lead_char = '0';

            /* check for a field width specifier */
            if (is_digit(*fmt))
            {
                /* scan the digits */
                for (fld_wid = 0 ; is_digit(*fmt) ; ++fmt)
                {
                    fld_wid *= 10;
                    fld_wid += value_of_digit(*fmt);
                }
            }
            else if (*fmt == '*')
            {
                /* the value is an integer taken from the arguments */
                fld_wid = va_arg(args, int);

                /* skip the '*' */
                ++fmt;
            }

            /* check for a precision specifier */
            if (*fmt == '.')
            {
                /* skip the '.' */
                ++fmt;

                /* check what we have */
                if (*fmt == '*')
                {
                    /* the value is an integer taken from the arguments */
                    fld_prec = va_arg(args, int);

                    /* skip the '*' */
                    ++fmt;
                }
                else
                {
                    /* scan the digits */
                    for (fld_prec = 0 ; is_digit(*fmt) ; ++fmt)
                    {
                        fld_prec *= 10;
                        fld_prec += value_of_digit(*fmt);
                    }
                }
            }
            
            /* check what follows */
            switch (*fmt)
            {
            case '%':
                /* it's a literal '%' */
                txt = "%";
                txtlen = 1;
                break;

            case 's':
                /* the value is a (char *) */
                txt = va_arg(args, char *);

                /* if it's null, show "(null)" */
                if (txt == 0)
                    txt = "(null)";

                /* get the length, limiting it to the precision */
                {
                    const char *p;

                    /* 
                     *   Scan until we reach a null terminator, or until our
                     *   length reaches the maximum given by the precision
                     *   qualifier.  
                     */
                    for (txtlen = 0, p = txt ;
                         *p != '\0' && (fld_prec == -1
                                        || txtlen < (size_t)fld_prec) ;
                         ++p, ++txtlen) ;
                }

                /* 
                 *   if the 'approximation' flag is specified, limit the
                 *   string to 60 characters or the field width, whichever
                 *   is less 
                 */
                if (approx)
                {
                    size_t lim;
                    
                    /* the default limit is 60 characters */
                    lim = 60;

                    /* 
                     *   if a field width is specified, it overrides the
                     *   default - but take out three characters for the
                     *   '...' suffix 
                     */
                    if (fld_wid != -1 && (size_t)fld_wid > lim)
                        lim = fld_wid - 3;

                    /* if we're over the limit, shorten the string */
                    if (txtlen > lim)
                    {
                        /* shorten the string to the limit */
                        txtlen = lim;

                        /* add an ellipsis to indicate the truncation */
                        add_ellipsis = TRUE;
                    }
                }

                /* 
                 *   if a field width was specified and we have the default
                 *   right alignment, pad to the left with spaces if the
                 *   width is greater than the actual length 
                 */
                if (fld_wid != -1 && !left_align)
                {
                    for ( ; (size_t)fld_wid > txtlen ; --fld_wid)
                    {
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = ' ';
                    }
                }
                break;

            case 'P':
                /* 
                 *   URL parameter - this is a (char*) value with url
                 *   encoding applied 
                 */
                txt = va_arg(args, char *);

                /* if it's null, use an empty string */
                if (txt == 0)
                    txt = "";

                /* use the field precision if given, or the string length */
                txtlen = (fld_prec >= 0 ? fld_prec : strlen(txt));

                /* encode the parameter and add it to the buffer */
                for ( ; txtlen != 0 ; --txtlen, ++txt)
                {
                    switch (*txt)
                    {
                    case '!':
                    case '*':
                    case '\'':
                    case '(':
                    case ')':
                    case ';':
                    case ':':
                    case '@':
                    case '&':
                    case '=':
                    case '+':
                    case '$':
                    case ',':
                    case '/':
                    case '?':
                    case '#':
                    case '[':
                    case ']':
                    case ' ':
                        /* use % encoding for special characters */
                        sprintf(buf, "%%%02x", (unsigned)(uchar)*txt);
                        need += 3;
                        for (i = 0 ; i < 3 ; ++i)
                        {
                            if (rem > 1)
                                *dst++ = buf[i], --rem;
                        }
                        break;

                    default:
                        /* copy anything else as-is */
                        need += 1;
                        if (rem > 1)
                            *dst++ = *txt, --rem;
                        break;
                    }
                }
                break;

            case 'c':
                /* the value is a (char) */
                buf[0] = (char)va_arg(args, int);
                txt = buf;
                txtlen = 1;
                break;

            case 'd':
                /* the value is an int, formatted in decimal */
                {
                    int ival = va_arg(args, int);
                    sprintf(buf, "%d", ival);

                    /* check for '%dth' notation (1st, 2nd, etc) */
                    nth = check_nth(fmt, ival);
                }
                /* fall through to num_common: */
                
            num_common:
                /* use the temporary buffer where we formatted the value */
                txt = buf;
                txtlen = strlen(buf);

                /* 
                 *   Pad with leading spaces or zeros if the requested
                 *   field width exceeds the actual size and we have the
                 *   default left alignment.  
                 */
                if (fld_wid != -1 && !left_align && (size_t)fld_wid > txtlen)
                {
                    /* 
                     *   if we're showing an explicit sign, and we don't have
                     *   a leading '-' in the results, add it 
                     */
                    if (plus && txt[0] != '-')
                    {
                        /* add the '+' at the start of the output */
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = '+';
                    }

                    /* 
                     *   if we're showing leading zeros, and we have a
                     *   negative number, show the '-' first 
                     */
                    if (lead_char == '0' && txt[0] == '-')
                    {
                        /* add the '-' at the start of the output */
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = '-';
                        
                        /* we've shown the '-', so skip it in the number */
                        ++txt;
                        --txtlen;
                    }

                    /* add the padding */
                    for ( ; (size_t)fld_wid > txtlen ; --fld_wid)
                    {
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = lead_char;
                    }
                }

                /* done */
                break;

            case 'u':
                /* the value is an int, formatted as unsigned decimal */
                sprintf(buf, "%u", va_arg(args, int));
                goto num_common;

            case 'x':
                /* the value is an int, formatted in hex */
                sprintf(buf, "%x", va_arg(args, int));
                goto num_common;

            case 'o':
                /* the value is an int, formatted in hex */
                sprintf(buf, "%o", va_arg(args, int));
                goto num_common;

            case 'l':
                /* it's a 'long' value - get the second specifier */
                switch (*++fmt)
                {
                case 'd':
                    /* it's a long, formatted in decimal */
                    sprintf(buf, "%ld", va_arg(args, long));
                    goto num_common;

                case 'u':
                    /* it's a long, formatted as unsigned decimal */
                    sprintf(buf, "%lu", va_arg(args, long));
                    goto num_common;

                case 'x':
                    /* it's a long, formatted in hex */
                    sprintf(buf, "%lx", va_arg(args, long));
                    goto num_common;

                case 'o':
                    /* it's a long, formatted in octal */
                    sprintf(buf, "%lo", va_arg(args, long));
                    goto num_common;

                default:
                    /* bad specifier - show the literal text */
                    txt = "%";
                    txtlen = 1;
                    fmt = fmt_start;
                    break;
                }
                break;

            default:
                /* bad specifier - show the literal text */
                txt = "%";
                txtlen = 1;
                fmt = fmt_start;
                break;
            }

            /* add the text to the buffer */
            for (i = txtlen ; i != 0 ; --i, ++txt)
            {
                ++need;
                if (rem > 1)
                    --rem, *dst++ = *txt;
            }

            /* add the 'nth' suffix, if applicable */
            for ( ; *nth != 0 ; ++nth)
            {
                ++need;
                if (rem > 1)
                    --rem, *dst++ = *nth;
            }

            /* add an ellipsis if desired */
            if (add_ellipsis)
            {
                /* add three '.' characters */
                for (i = 3 ; i != 0 ; --i)
                {
                    ++need;
                    if (rem > 1)
                        --rem, *dst++ = '.';
                }

                /* for padding purposes, count the ellipsis */
                txtlen += 3;
            }

            /* 
             *   if we have left alignment and the actual length is less
             *   than the field width, pad to the right with spaces 
             */
            if (left_align && fld_wid != -1 && (size_t)fld_wid > txtlen)
            {
                /* add spaces to pad out to the field width */
                for (i = fld_wid ; i > txtlen ; --i)
                {
                    ++need;
                    if (rem > 1)
                        --rem, *dst++ = ' ';
                }
            }
        }
        else
        {
            /* it's not a format specifier - just copy it literally */
            ++need;
            if (rem > 1)
                --rem, *dst++ = *fmt;
        }
    }

    /* add the trailing null */
    if (rem != 0)
        *dst = '\0';

    /* bracket the va_copy at the top of the function */
    os_va_copy_end(args);

    /* return the needed length */
    return need;
}